

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O3

golf_ball_contact_t *
golf_ball_contact(golf_ball_contact_t *__return_storage_ptr__,vec3 a,vec3 b,vec3 c,vec3 vel,vec3 bp,
                 float br,vec3 cp,float dist,float restitution,float friction,float vel_scale,
                 triangle_contact_type_t type,_Bool is_water,vec3 water_dir,_Bool is_out_of_bounds)

{
  float fVar1;
  vec3 vVar2;
  vec3 v2;
  vec3 vVar3;
  
  vVar3 = cp;
  __return_storage_ptr__->is_water = is_water;
  __return_storage_ptr__->is_ignored = false;
  (__return_storage_ptr__->position).x = cp.x;
  (__return_storage_ptr__->position).y = cp.y;
  (__return_storage_ptr__->position).z = cp.z;
  vVar2 = vec3_sub(b,a);
  v2 = vec3_sub(c,a);
  vVar2 = vec3_cross(vVar2,v2);
  vVar2 = vec3_normalize(vVar2);
  (__return_storage_ptr__->triangle_normal).x = (float)(int)vVar2._0_8_;
  (__return_storage_ptr__->triangle_normal).y = (float)(int)((ulong)vVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->triangle_normal).z = vVar2.z;
  if (type < TRIANGLE_CONTACT_FACE) {
    vVar3 = vec3_sub(bp,vVar3);
    vVar3 = vec3_normalize(vVar3);
    (__return_storage_ptr__->normal).x = (float)(int)vVar3._0_8_;
    (__return_storage_ptr__->normal).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
    (__return_storage_ptr__->normal).z = vVar3.z;
  }
  else if (type == TRIANGLE_CONTACT_FACE) {
    (__return_storage_ptr__->normal).z = (__return_storage_ptr__->triangle_normal).z;
    fVar1 = (__return_storage_ptr__->triangle_normal).y;
    (__return_storage_ptr__->normal).x = (__return_storage_ptr__->triangle_normal).x;
    (__return_storage_ptr__->normal).y = fVar1;
  }
  (__return_storage_ptr__->velocity).x = (float)(int)vel._0_8_;
  (__return_storage_ptr__->velocity).y = (float)(int)((ulong)vel._0_8_ >> 0x20);
  (__return_storage_ptr__->velocity).z = vel.z;
  (__return_storage_ptr__->triangle_a).x = (float)(int)a._0_8_;
  (__return_storage_ptr__->triangle_a).y = (float)(int)((ulong)a._0_8_ >> 0x20);
  (__return_storage_ptr__->triangle_a).z = a.z;
  (__return_storage_ptr__->triangle_b).x = (float)(int)b._0_8_;
  (__return_storage_ptr__->triangle_b).y = (float)(int)((ulong)b._0_8_ >> 0x20);
  (__return_storage_ptr__->triangle_b).z = b.z;
  (__return_storage_ptr__->triangle_c).x = (float)(int)c._0_8_;
  (__return_storage_ptr__->triangle_c).y = (float)(int)((ulong)c._0_8_ >> 0x20);
  (__return_storage_ptr__->triangle_c).z = c.z;
  __return_storage_ptr__->restitution = restitution;
  __return_storage_ptr__->friction = friction;
  __return_storage_ptr__->vel_scale = vel_scale;
  __return_storage_ptr__->type = type;
  __return_storage_ptr__->penetration = br - dist;
  (__return_storage_ptr__->water_dir).x = water_dir.x;
  (__return_storage_ptr__->water_dir).y = water_dir.y;
  (__return_storage_ptr__->water_dir).z = water_dir.z;
  __return_storage_ptr__->is_out_of_bounds = is_out_of_bounds;
  return __return_storage_ptr__;
}

Assistant:

golf_ball_contact_t golf_ball_contact(vec3 a, vec3 b, vec3 c, vec3 vel, vec3 bp, float br, vec3 cp, float dist, float restitution, float friction, float vel_scale, triangle_contact_type_t type, bool is_water, vec3 water_dir, bool is_out_of_bounds) {
    golf_ball_contact_t contact;
    contact.is_water = is_water;
    contact.is_ignored = false;
    contact.position = cp;
    contact.triangle_normal = vec3_normalize(vec3_cross(vec3_sub(b, a), vec3_sub(c, a)));
    switch (type) {
        case TRIANGLE_CONTACT_FACE:
            contact.normal = contact.triangle_normal;
            break;
        case TRIANGLE_CONTACT_AB:
        case TRIANGLE_CONTACT_AC:
        case TRIANGLE_CONTACT_BC:
        case TRIANGLE_CONTACT_A:
        case TRIANGLE_CONTACT_B:
        case TRIANGLE_CONTACT_C:
            contact.normal = vec3_normalize(vec3_sub(bp, cp));
            break;
    }
    contact.velocity = vel;
    contact.triangle_a = a;
    contact.triangle_b = b;
    contact.triangle_c = c;
    contact.restitution = restitution;
    contact.friction = friction;
    contact.vel_scale = vel_scale;
    contact.type = type;
    contact.penetration = br - dist;
    contact.water_dir = water_dir;
    contact.is_out_of_bounds = is_out_of_bounds;
    return contact;
}